

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O2

uint32_t cab_checksum_cfdata_4(void *p,size_t bytes,uint32_t seed)

{
  long lVar1;
  
  for (lVar1 = 0; ((uint)(bytes >> 2) & 0x3fffffff) != (uint)lVar1; lVar1 = lVar1 + 1) {
    seed = seed ^ *(uint *)((long)p + lVar1 * 4);
  }
  return seed;
}

Assistant:

static uint32_t
cab_checksum_cfdata_4(const void *p, size_t bytes, uint32_t seed)
{
	const unsigned char *b;
	unsigned u32num;
	uint32_t sum;

	u32num = (unsigned)bytes / 4;
	sum = seed;
	b = p;
	for (;u32num > 0; --u32num) {
		sum ^= archive_le32dec(b);
		b += 4;
	}
	return (sum);
}